

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

uint64_t helper_divu64(CPUS390XState_conflict *env,uint64_t ah,uint64_t al,uint64_t b)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  uintptr_t unaff_retaddr;
  
  if (b != 0) {
    if (ah == 0) {
      uVar1 = al / b;
      env->retxl = al % b;
    }
    else {
      auVar2 = __udivti3(al,ah,b,0);
      uVar1 = auVar2._0_8_;
      env->retxl = al - b * uVar1;
      if (auVar2._8_8_ != 0) goto LAB_00cbf196;
    }
    return uVar1;
  }
LAB_00cbf196:
  tcg_s390_program_interrupt_s390x(env,9,unaff_retaddr);
}

Assistant:

uint64_t HELPER(divu64)(CPUS390XState *env, uint64_t ah, uint64_t al,
                        uint64_t b)
{
    uint64_t ret;
    /* Signal divide by zero.  */
    if (b == 0) {
        tcg_s390_program_interrupt(env, PGM_FIXPT_DIVIDE, GETPC());
    }
    if (ah == 0) {
        /* 64 -> 64/64 case */
        env->retxl = al % b;
        ret = al / b;
    } else {
        /* ??? Move i386 idivq helper to host-utils.  */
#ifdef CONFIG_INT128
        __uint128_t a = ((__uint128_t)ah << 64) | al;
        __uint128_t q = a / b;
        env->retxl = a % b;
        ret = q;
        if (ret != q) {
            tcg_s390_program_interrupt(env, PGM_FIXPT_DIVIDE, GETPC());
        }
#else
        /* 32-bit hosts would need special wrapper functionality - just abort if
           we encounter such a case; it's very unlikely anyways. */
        cpu_abort(env_cpu(env), "128 -> 64/64 division not implemented\n");
#endif
    }
    return ret;
}